

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::FieldOptions::MergeFrom(FieldOptions *this,FieldOptions *from)

{
  int *piVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  UninterpretedOption *from_00;
  void **ppvVar7;
  LogMessage *other;
  UninterpretedOption *this_00;
  string *psVar8;
  long lVar9;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x1679);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
             (from->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ +
             (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_) {
    lVar9 = 0;
    do {
      from_00 = (UninterpretedOption *)
                (from->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_[lVar9];
      iVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
      iVar5 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar4 < iVar5) {
        ppvVar7 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_;
        (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
        this_00 = (UninterpretedOption *)ppvVar7[iVar4];
      }
      else {
        iVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar5 == iVar4) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,iVar4 + 1);
        }
        piVar1 = &(this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        this_00 = internal::GenericTypeHandler<google::protobuf::UninterpretedOption>::New();
        ppvVar7 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_;
        iVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
        (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
        ppvVar7[iVar4] = this_00;
      }
      UninterpretedOption::MergeFrom(this_00,from_00);
      lVar9 = lVar9 + 1;
    } while (lVar9 < (from->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
  }
  bVar2 = (byte)from->_has_bits_[0];
  if (bVar2 != 0) {
    if ((bVar2 & 1) != 0) {
      uVar6 = from->ctype_;
      if (2 < uVar6) {
        __assert_fail("::google::protobuf::FieldOptions_CType_IsValid(value)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/descriptor.pb.h"
                      ,0x1391,
                      "void google::protobuf::FieldOptions::set_ctype(::google::protobuf::FieldOptions_CType)"
                     );
      }
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
      this->ctype_ = uVar6;
    }
    if ((from->_has_bits_[0] & 2) != 0) {
      bVar3 = from->packed_;
      this->_has_bits_[0] = this->_has_bits_[0] | 2;
      this->packed_ = bVar3;
    }
    if ((from->_has_bits_[0] & 4) != 0) {
      bVar3 = from->lazy_;
      this->_has_bits_[0] = this->_has_bits_[0] | 4;
      this->lazy_ = bVar3;
    }
    if ((from->_has_bits_[0] & 8) != 0) {
      bVar3 = from->deprecated_;
      this->_has_bits_[0] = this->_has_bits_[0] | 8;
      this->deprecated_ = bVar3;
    }
    if ((from->_has_bits_[0] & 0x10) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 0x10;
      if (this->experimental_map_key_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar8 = (string *)operator_new(0x20);
        (psVar8->_M_dataplus)._M_p = (pointer)&psVar8->field_2;
        psVar8->_M_string_length = 0;
        (psVar8->field_2)._M_local_buf[0] = '\0';
        this->experimental_map_key_ = psVar8;
      }
      std::__cxx11::string::_M_assign((string *)this->experimental_map_key_);
    }
    if ((from->_has_bits_[0] & 0x20) != 0) {
      bVar3 = from->weak_;
      this->_has_bits_[0] = this->_has_bits_[0] | 0x20;
      this->weak_ = bVar3;
    }
  }
  internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void FieldOptions::MergeFrom(const FieldOptions& from) {
  GOOGLE_CHECK_NE(&from, this);
  uninterpreted_option_.MergeFrom(from.uninterpreted_option_);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_ctype()) {
      set_ctype(from.ctype());
    }
    if (from.has_packed()) {
      set_packed(from.packed());
    }
    if (from.has_lazy()) {
      set_lazy(from.lazy());
    }
    if (from.has_deprecated()) {
      set_deprecated(from.deprecated());
    }
    if (from.has_experimental_map_key()) {
      set_experimental_map_key(from.experimental_map_key());
    }
    if (from.has_weak()) {
      set_weak(from.weak());
    }
  }
  _extensions_.MergeFrom(from._extensions_);
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}